

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O2

void SetWallScroller(int id,int sidechoice,double dx,double dy,EScrollPos Where)

{
  ulong uVar1;
  bool bVar2;
  DThinker *pDVar3;
  FThinkerCollection *pFVar4;
  DScroller *this;
  ulong uVar5;
  EScrollPos scrollpos;
  uint uVar6;
  int affectee;
  TArray<FThinkerCollection,_FThinkerCollection> Collection;
  FThinkerCollection collect;
  TThinkerIterator<DScroller> iterator;
  
  scrollpos = Where & scw_all;
  if (scrollpos != 0) {
    if ((((dx != 0.0) || (NAN(dx))) || (dy != 0.0)) || (NAN(dy))) {
      Collection.Array = (FThinkerCollection *)0x0;
      Collection.Most = 0;
      Collection.Count = 0;
      TThinkerIterator<DScroller>::TThinkerIterator(&iterator,0x20);
      while( true ) {
        collect.Obj = FThinkerIterator::Next(&iterator.super_FThinkerIterator,false);
        if (collect.Obj == (DThinker *)0x0) break;
        collect.RefNum =
             -(uint)(*(int *)&collect.Obj[1].super_DObject._vptr_DObject != 0) |
             *(uint *)&collect.Obj[1].super_DObject.GCNext;
        if (collect.RefNum != 0xffffffff) {
          bVar2 = FTagManager::LineHasID(&tagManager,sides[collect.RefNum].linedef,id);
          if (((bVar2) &&
              (collect.RefNum ==
               (int)(((long)(sides[collect.RefNum].linedef)->sidedef[sidechoice] - (long)sides) /
                    0xc0))) &&
             (scrollpos == *(EScrollPos *)((long)&collect.Obj[2].super_DObject._vptr_DObject + 4)))
          {
            collect.Obj[1].super_DObject.Class = (PClass *)dx;
            collect.Obj[1].super_DObject.ObjNext = (DObject *)dy;
            TArray<FThinkerCollection,_FThinkerCollection>::Push(&Collection,&collect);
          }
        }
      }
      uVar1 = (ulong)Collection._8_8_ >> 0x20;
      iterator.super_FThinkerIterator.m_ParentType._4_4_ =
           tagManager.IDHashFirst[(ulong)(uint)id & 0xff];
      collect.Obj = (DThinker *)0x0;
      iterator.super_FThinkerIterator.m_ParentType._0_4_ = id;
LAB_00442545:
      uVar6 = FLineIdIterator::Next((FLineIdIterator *)&iterator);
      if (-1 < (int)uVar6) {
        if (lines[uVar6].sidedef[sidechoice] != (side_t *)0x0) {
          pFVar4 = Collection.Array;
          uVar5 = uVar1;
          while( true ) {
            affectee = (int)(((long)lines[uVar6].sidedef[sidechoice] - (long)sides) / 0xc0);
            if (uVar5 == 0) break;
            if (pFVar4->RefNum == affectee) {
              if ((int)uVar5 != 0) goto LAB_00442545;
              break;
            }
            pFVar4 = pFVar4 + 1;
            uVar5 = uVar5 - 1;
          }
          this = (DScroller *)DObject::operator_new(0x90);
          DScroller::DScroller(this,sc_side,dx,dy,-1,affectee,0,scrollpos);
        }
        goto LAB_00442545;
      }
      TArray<FThinkerCollection,_FThinkerCollection>::~TArray(&Collection);
    }
    else {
      TThinkerIterator<DScroller>::TThinkerIterator
                ((TThinkerIterator<DScroller> *)&iterator.super_FThinkerIterator,0x20);
      while( true ) {
        pDVar3 = FThinkerIterator::Next(&iterator.super_FThinkerIterator,false);
        if (pDVar3 == (DThinker *)0x0) break;
        uVar6 = -(uint)(*(int *)&pDVar3[1].super_DObject._vptr_DObject != 0) |
                *(uint *)&pDVar3[1].super_DObject.GCNext;
        if (-1 < (int)uVar6) {
          bVar2 = FTagManager::LineHasID(&tagManager,sides[uVar6].linedef,id);
          if (((bVar2) &&
              (uVar6 == (uint)(((long)(sides[uVar6].linedef)->sidedef[sidechoice] - (long)sides) /
                              0xc0))) &&
             (scrollpos == *(EScrollPos *)((long)&pDVar3[2].super_DObject._vptr_DObject + 4))) {
            (*(pDVar3->super_DObject)._vptr_DObject[4])(pDVar3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SetWallScroller (int id, int sidechoice, double dx, double dy, EScrollPos Where)
{
	Where = Where & scw_all;
	if (Where == 0) return;

	if (dx == 0 && dy == 0)
	{
		// Special case: Remove the scroller, because the deltas are both 0.
		TThinkerIterator<DScroller> iterator (STAT_SCROLLER);
		DScroller *scroller;

		while ( (scroller = iterator.Next ()) )
		{
			int wallnum = scroller->GetWallNum ();

			if (wallnum >= 0 && tagManager.LineHasID(sides[wallnum].linedef, id) &&
				int(sides[wallnum].linedef->sidedef[sidechoice] - sides) == wallnum &&
				Where == scroller->GetScrollParts())
			{
				scroller->Destroy ();
			}
		}
	}
	else
	{
		// Find scrollers already attached to the matching walls, and change
		// their rates.
		TArray<FThinkerCollection> Collection;
		{
			TThinkerIterator<DScroller> iterator (STAT_SCROLLER);
			FThinkerCollection collect;

			while ( (collect.Obj = iterator.Next ()) )
			{
				if ((collect.RefNum = ((DScroller *)collect.Obj)->GetWallNum ()) != -1 &&
					tagManager.LineHasID(sides[collect.RefNum].linedef, id) &&
					int(sides[collect.RefNum].linedef->sidedef[sidechoice] - sides) == collect.RefNum &&
					Where == ((DScroller *)collect.Obj)->GetScrollParts())
				{
					((DScroller *)collect.Obj)->SetRate (dx, dy);
					Collection.Push (collect);
				}
			}
		}

		size_t numcollected = Collection.Size ();
		int linenum;

		// Now create scrollers for any walls that don't already have them.
		FLineIdIterator itr(id);
		while ((linenum = itr.Next()) >= 0)
		{
			if (lines[linenum].sidedef[sidechoice] != NULL)
			{
				int sidenum = int(lines[linenum].sidedef[sidechoice] - sides);
				unsigned int i;
				for (i = 0; i < numcollected; i++)
				{
					if (Collection[i].RefNum == sidenum)
						break;
				}
				if (i == numcollected)
				{
					new DScroller (EScroll::sc_side, dx, dy, -1, sidenum, 0, Where);
				}
			}
		}
	}
}